

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::compiler::Declaration::Builder::initAnnotation(Builder *__return_storage_ptr__,Builder *this)

{
  byte *pbVar1;
  void *pvVar2;
  SegmentBuilder *pSVar3;
  CapTableBuilder *pCVar4;
  WirePointer *pWVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  PointerBuilder local_28;
  
  pvVar2 = (this->_builder).data;
  *(undefined2 *)((long)pvVar2 + 2) = 0xb;
  pbVar1 = (byte *)((long)pvVar2 + 0xc);
  *pbVar1 = *pbVar1 & 0xfe;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xc);
  *pbVar1 = *pbVar1 & 0xfd;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xc);
  *pbVar1 = *pbVar1 & 0xfb;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xc);
  *pbVar1 = *pbVar1 & 0xf7;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xc);
  *pbVar1 = *pbVar1 & 0xef;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xc);
  *pbVar1 = *pbVar1 & 0xdf;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xc);
  *pbVar1 = *pbVar1 & 0xbf;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xc);
  *pbVar1 = *pbVar1 & 0x7f;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xd);
  *pbVar1 = *pbVar1 & 0xfe;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xd);
  *pbVar1 = *pbVar1 & 0xfd;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xd);
  *pbVar1 = *pbVar1 & 0xfb;
  pbVar1 = (byte *)((long)(this->_builder).data + 0xd);
  *pbVar1 = *pbVar1 & 0xf7;
  local_28.pointer = (this->_builder).pointers + 5;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::clear(&local_28);
  SVar6 = (this->_builder).pointerCount;
  uVar7 = *(undefined2 *)&(this->_builder).field_0x26;
  (__return_storage_ptr__->_builder).dataSize = (this->_builder).dataSize;
  (__return_storage_ptr__->_builder).pointerCount = SVar6;
  *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = uVar7;
  pSVar3 = (this->_builder).segment;
  pCVar4 = (this->_builder).capTable;
  pWVar5 = (this->_builder).pointers;
  (__return_storage_ptr__->_builder).data = (this->_builder).data;
  (__return_storage_ptr__->_builder).pointers = pWVar5;
  (__return_storage_ptr__->_builder).segment = pSVar3;
  (__return_storage_ptr__->_builder).capTable = pCVar4;
  return __return_storage_ptr__;
}

Assistant:

inline typename Declaration::Annotation::Builder Declaration::Builder::initAnnotation() {
  _builder.setDataField<Declaration::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, Declaration::ANNOTATION);
  _builder.setDataField<bool>(::capnp::bounded<96>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<97>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<98>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<99>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<100>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<101>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<102>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<103>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<104>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<105>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<106>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<107>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<5>() * ::capnp::POINTERS).clear();
  return typename Declaration::Annotation::Builder(_builder);
}